

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall upb::generator::Output::operator()<>(Output *this,string_view format)

{
  string_view data;
  string result;
  char *local_30;
  size_t local_28;
  char local_20;
  undefined7 uStack_1f;
  
  local_28 = 0;
  local_20 = '\0';
  local_30 = &local_20;
  absl::lts_20240722::substitute_internal::SubstituteAndAppendArray
            (&local_30,format._M_len,format._M_str,0,0);
  data._M_str = local_30;
  data._M_len = local_28;
  Write(this,data);
  if (local_30 != &local_20) {
    operator_delete(local_30,CONCAT71(uStack_1f,local_20) + 1);
  }
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }